

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O2

void check_buffer_size(uv_handle_t *handle)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  int value;
  
  value = 0;
  iVar1 = uv_recv_buffer_size(handle,&value);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    eval_a = (int64_t)value;
    if (eval_a < 1) {
      pcVar3 = ">";
      pcVar2 = "value";
      uVar4 = 0x2c;
    }
    else {
      value = 10000;
      iVar1 = uv_recv_buffer_size(handle,&value);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        value = 0;
        iVar1 = uv_recv_buffer_size(handle,&value);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          if ((value != 10000) && (value != 20000)) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
                    ,0x34,"value == 10000 || value == 20000");
            abort();
          }
          return;
        }
        pcVar3 = "==";
        pcVar2 = "uv_recv_buffer_size(handle, &value)";
        uVar4 = 0x32;
      }
      else {
        pcVar3 = "==";
        pcVar2 = "uv_recv_buffer_size(handle, &value)";
        uVar4 = 0x2f;
      }
    }
  }
  else {
    pcVar3 = "==";
    pcVar2 = "uv_recv_buffer_size(handle, &value)";
    uVar4 = 0x2b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
          ,uVar4,pcVar2,pcVar3,"0",eval_a,pcVar3,0);
  abort();
}

Assistant:

static void check_buffer_size(uv_handle_t* handle) {
  int value;

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  ASSERT_GT(value, 0);

  value = 10000;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));

  value = 0;
  ASSERT_OK(uv_recv_buffer_size(handle, &value));
  /* linux sets double the value */
  ASSERT(value == 10000 || value == 20000);
}